

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::password(Config *this,string *parameter)

{
  element_type *peVar1;
  shared_ptr<char> local_28;
  string *local_18;
  string *parameter_local;
  Config *this_local;
  
  local_18 = parameter;
  parameter_local = (string *)this;
  QUtil::make_shared_cstr((QUtil *)&local_28,parameter);
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  std::shared_ptr<char>::operator=(&peVar1->password,&local_28);
  std::shared_ptr<char>::~shared_ptr(&local_28);
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::password(std::string const& parameter)
{
    o.m->password = QUtil::make_shared_cstr(parameter);
    return this;
}